

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream * QtPrivate::readArrayBasedContainer<QList<int>>(QDataStream *s,QList<int> *c)

{
  Status SVar1;
  qint64 qVar2;
  QList<int> *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000008;
  qsizetype i;
  qsizetype n;
  qint64 size;
  value_type_conflict3 t;
  StreamStateSaver stateSaver;
  undefined4 in_stack_ffffffffffffff98;
  parameter_type in_stack_ffffffffffffff9c;
  StreamStateSaver *in_stack_ffffffffffffffa0;
  long local_58;
  int local_1c;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  StreamStateSaver::StreamStateSaver
            (in_stack_ffffffffffffffa0,
             (QDataStream *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  QList<int>::clear((QList<int> *)in_stack_ffffffffffffffa0);
  qVar2 = QDataStream::readQSizeType((QDataStream *)in_stack_ffffffffffffffa0);
  if (qVar2 < 0) {
    QDataStream::setStatus((Status)in_RDI);
  }
  else {
    QList<int>::reserve(in_RSI,in_stack_00000008);
    for (local_58 = 0; local_58 < qVar2; local_58 = local_58 + 1) {
      local_1c = -0x55555556;
      QDataStream::operator>>(in_RDI,&local_1c);
      SVar1 = QDataStream::status(in_RDI);
      if (SVar1 != Ok) {
        QList<int>::clear((QList<int> *)in_stack_ffffffffffffffa0);
        break;
      }
      QList<int>::append((QList<int> *)0x54baa8,in_stack_ffffffffffffff9c);
    }
  }
  StreamStateSaver::~StreamStateSaver(in_stack_ffffffffffffffa0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}